

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O1

void textui_cmd_ignore(void)

{
  _Bool _Var1;
  object *in_RAX;
  object *obj;
  object *local_8;
  
  local_8 = in_RAX;
  _Var1 = get_item(&local_8,"Ignore which item? ","You have nothing to ignore.",CMD_IGNORE,
                   (item_tester)0x0,L'\x0f');
  if (_Var1) {
    textui_cmd_ignore_menu(local_8);
  }
  return;
}

Assistant:

void textui_cmd_ignore(void)
{
	struct object *obj;

	/* Get an item */
	const char *q = "Ignore which item? ";
	const char *s = "You have nothing to ignore.";
	if (!get_item(&obj, q, s, CMD_IGNORE, NULL,
				  USE_INVEN | USE_QUIVER | USE_EQUIP | USE_FLOOR))
		return;

	textui_cmd_ignore_menu(obj);
}